

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

void __thiscall
wabt::SharedValidator::SharedValidator
          (SharedValidator *this,Errors *errors,ValidateOptions *options)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  bVar9 = (options->features).exceptions_enabled_;
  bVar10 = (options->features).mutable_globals_enabled_;
  bVar11 = (options->features).sat_float_to_int_enabled_;
  bVar12 = (options->features).sign_extension_enabled_;
  bVar13 = (options->features).simd_enabled_;
  bVar14 = (options->features).threads_enabled_;
  bVar15 = (options->features).multi_value_enabled_;
  bVar16 = (options->features).tail_call_enabled_;
  bVar2 = (options->features).multi_value_enabled_;
  bVar3 = (options->features).tail_call_enabled_;
  bVar4 = (options->features).bulk_memory_enabled_;
  bVar5 = (options->features).reference_types_enabled_;
  bVar6 = (options->features).annotations_enabled_;
  bVar7 = (options->features).gc_enabled_;
  bVar8 = (options->features).memory64_enabled_;
  (this->options_).features.threads_enabled_ = (options->features).threads_enabled_;
  (this->options_).features.multi_value_enabled_ = bVar2;
  (this->options_).features.tail_call_enabled_ = bVar3;
  (this->options_).features.bulk_memory_enabled_ = bVar4;
  (this->options_).features.reference_types_enabled_ = bVar5;
  (this->options_).features.annotations_enabled_ = bVar6;
  (this->options_).features.gc_enabled_ = bVar7;
  (this->options_).features.memory64_enabled_ = bVar8;
  (this->options_).features.exceptions_enabled_ = bVar9;
  (this->options_).features.mutable_globals_enabled_ = bVar10;
  (this->options_).features.sat_float_to_int_enabled_ = bVar11;
  (this->options_).features.sign_extension_enabled_ = bVar12;
  (this->options_).features.simd_enabled_ = bVar13;
  (this->options_).features.threads_enabled_ = bVar14;
  (this->options_).features.multi_value_enabled_ = bVar15;
  (this->options_).features.tail_call_enabled_ = bVar16;
  this->errors_ = errors;
  *(undefined8 *)&(this->typechecker_).error_callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->typechecker_).error_callback_.super__Function_base._M_functor + 8) =
       0;
  (this->typechecker_).error_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->typechecker_).error_callback_._M_invoker = (_Invoker_type)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typechecker_).br_table_sig_ = (TypeVector *)0x0;
  bVar2 = (options->features).mutable_globals_enabled_;
  bVar3 = (options->features).sat_float_to_int_enabled_;
  bVar4 = (options->features).sign_extension_enabled_;
  bVar5 = (options->features).simd_enabled_;
  bVar6 = (options->features).threads_enabled_;
  bVar7 = (options->features).multi_value_enabled_;
  bVar8 = (options->features).tail_call_enabled_;
  bVar9 = (options->features).threads_enabled_;
  bVar10 = (options->features).multi_value_enabled_;
  bVar11 = (options->features).tail_call_enabled_;
  bVar12 = (options->features).bulk_memory_enabled_;
  bVar13 = (options->features).reference_types_enabled_;
  bVar14 = (options->features).annotations_enabled_;
  bVar15 = (options->features).gc_enabled_;
  bVar16 = (options->features).memory64_enabled_;
  (this->typechecker_).features_.exceptions_enabled_ = (options->features).exceptions_enabled_;
  (this->typechecker_).features_.mutable_globals_enabled_ = bVar2;
  (this->typechecker_).features_.sat_float_to_int_enabled_ = bVar3;
  (this->typechecker_).features_.sign_extension_enabled_ = bVar4;
  (this->typechecker_).features_.simd_enabled_ = bVar5;
  (this->typechecker_).features_.threads_enabled_ = bVar6;
  (this->typechecker_).features_.multi_value_enabled_ = bVar7;
  (this->typechecker_).features_.tail_call_enabled_ = bVar8;
  (this->typechecker_).features_.threads_enabled_ = bVar9;
  (this->typechecker_).features_.multi_value_enabled_ = bVar10;
  (this->typechecker_).features_.tail_call_enabled_ = bVar11;
  (this->typechecker_).features_.bulk_memory_enabled_ = bVar12;
  (this->typechecker_).features_.reference_types_enabled_ = bVar13;
  (this->typechecker_).features_.annotations_enabled_ = bVar14;
  (this->typechecker_).features_.gc_enabled_ = bVar15;
  (this->typechecker_).features_.memory64_enabled_ = bVar16;
  this->expr_loc_ = (Location *)0x0;
  this->num_types_ = 0;
  p_Var1 = &(this->func_types_)._M_t._M_impl.super__Rb_tree_header;
  (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->struct_types_)._M_t._M_impl.super__Rb_tree_header;
  (this->struct_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->struct_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->struct_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->struct_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->struct_types_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->array_types_)._M_t._M_impl.super__Rb_tree_header;
  (this->array_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->array_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->array_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->array_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->locals_).
  super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->locals_).
  super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->locals_).
  super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->export_names_)._M_t._M_impl.super__Rb_tree_header;
  (this->export_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->export_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->array_types_)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xa4);
  (this->export_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->export_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->export_names_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header;
  (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->init_expr_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_expr_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_expr_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/shared-validator.cc:32:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/shared-validator.cc:32:7)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  std::function<void_(const_char_*)>::operator=
            (&(this->typechecker_).error_callback_,(function<void_(const_char_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

SharedValidator::SharedValidator(Errors* errors, const ValidateOptions& options)
    : options_(options), errors_(errors), typechecker_(options.features) {
  typechecker_.set_error_callback(
      [this](const char* msg) { OnTypecheckerError(msg); });
}